

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gestures.h
# Opt level: O0

void UpdateGestures(void)

{
  double dVar1;
  
  if (((GESTURES.current == 1) || (GESTURES.current == 2)) && (GESTURES.Touch.pointCount < 2)) {
    GESTURES.current = 4;
    GESTURES.Hold.timeDuration = GetCurrentTime();
  }
  dVar1 = GetCurrentTime();
  if (((300.0 < dVar1 - GESTURES.Touch.eventTime) && (GESTURES.current == 8)) &&
     (GESTURES.Touch.pointCount < 2)) {
    GESTURES.current = 4;
    GESTURES.Hold.timeDuration = GetCurrentTime();
    GESTURES.Hold.resetRequired = true;
  }
  if (((GESTURES.current == 0x10) || (GESTURES.current == 0x40)) ||
     ((GESTURES.current == 0x20 || (GESTURES.current == 0x80)))) {
    GESTURES.current = 0;
  }
  return;
}

Assistant:

void UpdateGestures(void)
{
    // NOTE: Gestures are processed through system callbacks on touch events

    // Detect GESTURE_HOLD
    if (((GESTURES.current == GESTURE_TAP) || (GESTURES.current == GESTURE_DOUBLETAP)) && (GESTURES.Touch.pointCount < 2))
    {
        GESTURES.current = GESTURE_HOLD;
        GESTURES.Hold.timeDuration = GetCurrentTime();
    }

    if (((GetCurrentTime() - GESTURES.Touch.eventTime) > TAP_TIMEOUT) && (GESTURES.current == GESTURE_DRAG) && (GESTURES.Touch.pointCount < 2))
    {
        GESTURES.current = GESTURE_HOLD;
        GESTURES.Hold.timeDuration = GetCurrentTime();
        GESTURES.Hold.resetRequired = true;
    }

    // Detect GESTURE_NONE
    if ((GESTURES.current == GESTURE_SWIPE_RIGHT) || (GESTURES.current == GESTURE_SWIPE_UP) || (GESTURES.current == GESTURE_SWIPE_LEFT) || (GESTURES.current == GESTURE_SWIPE_DOWN))
    {
        GESTURES.current = GESTURE_NONE;
    }
}